

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

void __thiscall
QCss::StyleSelector::matchRule
          (StyleSelector *this,NodePtr node,StyleRule *rule,StyleSheetOrigin origin,int depth,
          QMultiMap<unsigned_int,_QCss::StyleRule> *weightedRules)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  QArrayDataPointer<QCss::BasicSelector> *this_00;
  QArrayDataPointer<QCss::BasicSelector> *other;
  long lVar5;
  int j;
  ulong uVar6;
  long in_FS_OFFSET;
  uint weight;
  StyleRule newRule;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = 0;
  for (uVar6 = 0; uVar6 < (ulong)(rule->selectors).d.size; uVar6 = uVar6 + 1) {
    other = (QArrayDataPointer<QCss::BasicSelector> *)
            ((long)&(((rule->selectors).d.ptr)->basicSelectors).d.d + lVar5);
    bVar3 = selectorMatches(this,(Selector *)other,node);
    if (bVar3) {
      iVar1 = rule->order;
      iVar4 = Selector::specificity((Selector *)other);
      weight = iVar4 * 0x100 + iVar1 + (origin + depth) * 0x100000;
      newRule._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
      newRule.declarations.d.ptr = (Declaration *)&DAT_aaaaaaaaaaaaaaaa;
      newRule.declarations.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      newRule.selectors.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      newRule.declarations.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      newRule.selectors.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      newRule.selectors.d.ptr = (Selector *)&DAT_aaaaaaaaaaaaaaaa;
      StyleRule::StyleRule(&newRule,rule);
      if (1 < (ulong)(rule->selectors).d.size) {
        QList<QCss::Selector>::resize(&newRule.selectors,1);
        this_00 = (QArrayDataPointer<QCss::BasicSelector> *)
                  QList<QCss::Selector>::data(&newRule.selectors);
        QArrayDataPointer<QCss::BasicSelector>::operator=(this_00,other);
      }
      QMultiMap<unsigned_int,_QCss::StyleRule>::insert(weightedRules,&weight,&newRule);
      StyleRule::~StyleRule(&newRule);
    }
    lVar5 = lVar5 + 0x18;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void StyleSelector::matchRule(NodePtr node, const StyleRule &rule, StyleSheetOrigin origin,
                               int depth, QMultiMap<uint, StyleRule> *weightedRules)
{
    for (int j = 0; j < rule.selectors.size(); ++j) {
        const Selector& selector = rule.selectors.at(j);
        if (selectorMatches(selector, node)) {
            uint weight = rule.order
                        + selector.specificity() *0x100
                        + (uint(origin) + depth)*0x100000;
            StyleRule newRule = rule;
            if (rule.selectors.size() > 1) {
                newRule.selectors.resize(1);
                newRule.selectors[0] = selector;
            }
            //We might have rules with the same weight if they came from a rule with several selectors
            weightedRules->insert(weight, newRule);
        }
    }
}